

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signpost_intrinsic_triangulation.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::SignpostIntrinsicTriangulation::flipEdgeManual
          (SignpostIntrinsicTriangulation *this,Edge e,double newLength,double forwardAngle,
          double reverseAngle,bool isOrig,bool reverseFlip)

{
  double dVar1;
  double *pdVar2;
  Vector2 *pVVar3;
  bool bVar4;
  unsigned_long uVar5;
  runtime_error *this_00;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  size_t i_3;
  uint uVar9;
  size_t i;
  double dVar10;
  double dVar11;
  Face f;
  Face f_00;
  
  sVar7 = e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
  ;
  f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
       e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh;
  uVar9 = 0;
  do {
    bVar4 = SurfaceMesh::flip(&((this->intrinsicMesh)._M_t.
                                super___uniq_ptr_impl<geometrycentral::surface::ManifoldSurfaceMesh,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_geometrycentral::surface::ManifoldSurfaceMesh_*,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
                                .
                                super__Head_base<0UL,_geometrycentral::surface::ManifoldSurfaceMesh_*,_false>
                               ._M_head_impl)->super_SurfaceMesh,e,false);
    if (!bVar4) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"could not perform manual flip");
      __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
  } while ((reverseFlip) && (bVar4 = uVar9 < 2, uVar9 = uVar9 + 1, bVar4));
  (this->intrinsicEdgeLengths).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data[sVar7] = newLength;
  (this->super_IntrinsicGeometryInterface).edgeLengths.data.
  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[sVar7] = newLength
  ;
  bVar4 = (f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
          mesh)->useImplicitTwinFlag;
  if (bVar4 == true) {
    uVar5 = sVar7 * 2;
  }
  else {
    uVar5 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar7];
  }
  pdVar2 = (this->intrinsicHalfedgeDirections).data.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  pdVar2[uVar5] = forwardAngle;
  if (bVar4 == false) {
    uVar8 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start
            [((f.
               super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
              mesh)->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start[sVar7]];
  }
  else {
    uVar8 = sVar7 * 2 ^ 1;
  }
  pdVar2[uVar8] = reverseAngle;
  if (bVar4 == false) {
    uVar8 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar7];
  }
  else {
    uVar8 = sVar7 * 2;
  }
  uVar5 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
           mesh)->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar8];
  uVar6 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
           mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar5];
  if (bVar4 == false) {
    uVar6 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar6];
  }
  else {
    uVar6 = uVar6 ^ 1;
  }
  dVar11 = (this->intrinsicHalfedgeDirections).data.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar8] *
           (1.0 / ((this->intrinsicVertexAngleSums).data.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   [uVar5] /
                  *(double *)
                   (&DAT_0029b9c0 +
                   (ulong)(((f.
                             super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                            .mesh)->heFaceArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar6] <
                          (f.
                           super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                          .mesh)->nFacesFillCount) * 8)));
  dVar10 = cos(dVar11);
  dVar11 = sin(dVar11);
  bVar4 = (f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
          mesh)->useImplicitTwinFlag;
  if (bVar4 == true) {
    uVar8 = uVar8 >> 1;
  }
  else {
    uVar8 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8];
  }
  dVar1 = (this->intrinsicEdgeLengths).data.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar8];
  if (bVar4 == false) {
    uVar5 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar7];
  }
  else {
    uVar5 = sVar7 * 2;
  }
  pVVar3 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertex.data.
           super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  pVVar3[uVar5].x = dVar1 * dVar10;
  pVVar3[uVar5].y = dVar11 * dVar1;
  if (bVar4 == false) {
    uVar8 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start
            [((f.
               super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
              mesh)->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start[sVar7]];
  }
  else {
    uVar8 = sVar7 * 2 ^ 1;
  }
  uVar5 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
           mesh)->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar8];
  uVar6 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
           mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar5];
  if (bVar4 == false) {
    uVar6 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar6];
  }
  else {
    uVar6 = uVar6 ^ 1;
  }
  dVar11 = (this->intrinsicHalfedgeDirections).data.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar8] *
           (1.0 / ((this->intrinsicVertexAngleSums).data.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   [uVar5] /
                  *(double *)
                   (&DAT_0029b9c0 +
                   (ulong)(((f.
                             super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                            .mesh)->heFaceArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar6] <
                          (f.
                           super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                          .mesh)->nFacesFillCount) * 8)));
  dVar10 = cos(dVar11);
  dVar11 = sin(dVar11);
  bVar4 = (f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
          mesh)->useImplicitTwinFlag;
  if (bVar4 == true) {
    uVar8 = uVar8 >> 1;
  }
  else {
    uVar8 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8];
  }
  dVar1 = (this->intrinsicEdgeLengths).data.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar8];
  if (bVar4 == false) {
    uVar8 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar7];
  }
  else {
    uVar8 = sVar7 * 2;
  }
  if (bVar4 == false) {
    uVar8 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar8];
  }
  else {
    uVar8 = uVar8 ^ 1;
  }
  pVVar3 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertex.data.
           super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  pVVar3[uVar8].x = dVar1 * dVar10;
  pVVar3[uVar8].y = dVar11 * dVar1;
  if (bVar4 == false) {
    uVar5 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar7];
  }
  else {
    uVar5 = sVar7 * 2;
  }
  f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
       ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh
        )->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start[uVar5];
  updateFaceBasis(this,f);
  if ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh)
      ->useImplicitTwinFlag == true) {
    uVar8 = sVar7 * 2;
  }
  else {
    uVar8 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar7];
  }
  if ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh)
      ->useImplicitTwinFlag == false) {
    uVar8 = ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
             .mesh)->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar8];
  }
  else {
    uVar8 = uVar8 ^ 1;
  }
  f_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
       ((f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh
        )->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start[uVar8];
  f_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
       f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh;
  updateFaceBasis(this,f_00);
  (this->edgeIsOriginal).data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage
  .m_data[sVar7] = isOrig;
  invokeEdgeFlipCallbacks(this,e);
  return;
}

Assistant:

void SignpostIntrinsicTriangulation::flipEdgeManual(Edge e, double newLength, double forwardAngle, double reverseAngle,
                                                    bool isOrig, bool reverseFlip) {

  int flipCount = reverseFlip ? 3 : 1; // three flips give opposite orientaiton
  for (int i = 0; i < flipCount; i++) {
    bool flipped = intrinsicMesh->flip(e, false);
    if (!flipped) throw std::runtime_error("could not perform manual flip");
  }

  intrinsicEdgeLengths[e] = newLength;
  edgeLengths[e] = newLength;

  // Update other derived geometric data
  intrinsicHalfedgeDirections[e.halfedge()] = forwardAngle;
  intrinsicHalfedgeDirections[e.halfedge().twin()] = reverseAngle;
  halfedgeVectorsInVertex[e.halfedge()] = halfedgeVector(e.halfedge());
  halfedgeVectorsInVertex[e.halfedge().twin()] = halfedgeVector(e.halfedge().twin());
  updateFaceBasis(e.halfedge().face());
  updateFaceBasis(e.halfedge().twin().face());

  edgeIsOriginal[e] = isOrig;
  invokeEdgeFlipCallbacks(e);
}